

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::FlushWaitCase::init(FlushWaitCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  EVP_PKEY_CTX *ctx_00;
  int local_1a0 [4];
  MessageBuilder local_190;
  FlushWaitCase *local_10;
  FlushWaitCase *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_FlushFinishCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_190,(char (*) [23])"glFlush() followed by ");
  local_1a0[0] = 200;
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1a0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])" ms busy wait");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  iVar1 = FlushFinishCase::init(&this->super_FlushFinishCase,ctx_00);
  return iVar1;
}

Assistant:

void init (void)
	{
		m_testCtx.getLog() << TestLog::Message << "glFlush() followed by " << int(WAIT_TIME_MS) << " ms busy wait" << TestLog::EndMessage;
		FlushFinishCase::init();
	}